

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btInternalEdgeUtility.cpp
# Opt level: O0

void __thiscall
btConnectivityProcessor::processTriangle
          (btConnectivityProcessor *this,btVector3 *triangle,int partId,int triangleIndex)

{
  btVector3 *pbVar1;
  int in_ECX;
  int in_EDX;
  long in_RDI;
  btScalar bVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  btVector3 bVar5;
  btVector3 computedNormalB_2;
  btQuaternion orn_2;
  btVector3 edge_3;
  btVector3 computedNormalB_1;
  btQuaternion orn_1;
  btVector3 edge_2;
  btScalar bla;
  btVector3 computedNormalB;
  btQuaternion orn;
  btVector3 edge_1;
  btScalar dotA;
  btVector3 calculatedNormalA;
  bool isConvex;
  btScalar correctedAngle;
  btScalar len2;
  btVector3 calculatedEdge;
  btScalar ang4;
  btScalar angle2;
  btVector3 tmp_3;
  btVector3 edgeCrossB;
  btVector3 tmp_2;
  btVector3 edgeCrossA;
  btVector3 normalB;
  btVector3 normalA;
  btTriangleShape tB;
  int otherIndexB;
  btTriangleShape tA;
  btVector3 edge;
  int otherIndexA;
  int sumvertsA;
  btTriangleInfo tmp_1;
  btTriangleInfo *info;
  int hash;
  int tmp;
  int j;
  int i;
  btScalar crossASqr;
  btScalar crossBSqr;
  int sharedVertsB [3];
  int sharedVertsA [3];
  int numshared;
  undefined4 in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa34;
  undefined1 in_stack_fffffffffffffa38 [16];
  btVector3 *v1;
  undefined1 in_stack_fffffffffffffa58 [16];
  undefined1 auVar6 [16];
  btVector3 *in_stack_fffffffffffffa68;
  btHashMap<btHashInt,_btTriangleInfo> *in_stack_fffffffffffffa70;
  btScalar local_4e4;
  btScalar local_438;
  btScalar bStack_434;
  btScalar local_3d8;
  btScalar bStack_3d4;
  btScalar local_390;
  btVector3 local_38c;
  btScalar local_37c;
  undefined8 local_368;
  undefined8 local_360;
  btScalar local_358;
  btVector3 local_354;
  btScalar local_344;
  undefined8 local_330;
  undefined8 local_328;
  btScalar local_320;
  btScalar local_31c;
  btVector3 local_318;
  btScalar local_308;
  undefined8 local_2f4;
  undefined8 local_2ec;
  btScalar local_2e4;
  undefined8 local_2e0;
  undefined8 local_2d8;
  bool local_2cd;
  btScalar local_2cc;
  btScalar local_2c8;
  undefined8 local_2c4;
  undefined8 local_2bc;
  btScalar local_2b4;
  btScalar local_2b0;
  btScalar local_2ac;
  btVector3 local_2a8;
  btScalar local_298;
  btScalar bStack_294;
  undefined8 local_290;
  btVector3 local_288;
  btScalar local_26c;
  btVector3 local_268;
  btScalar local_258;
  btScalar bStack_254;
  undefined8 local_250;
  btVector3 local_248;
  btVector3 local_234;
  btVector3 local_224 [10];
  int local_184;
  undefined8 local_fc;
  undefined8 local_f4;
  int local_ec;
  int local_e8;
  btHashInt local_e4;
  btHashInt local_e0;
  btTriangleInfo local_dc;
  btHashInt local_cc;
  btTriangleInfo *local_c8;
  int local_c0;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined8 local_b0;
  int local_a8;
  int local_a4;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  btScalar local_70;
  undefined8 local_6c;
  undefined8 local_64;
  undefined8 local_5c;
  undefined8 local_54;
  undefined8 local_4c;
  undefined8 local_44;
  btScalar local_3c;
  undefined8 local_38;
  undefined4 local_30;
  int local_28 [10];
  
  if ((*(int *)(in_RDI + 8) != in_EDX) || (*(int *)(in_RDI + 0xc) != in_ECX)) {
    local_28[3] = 0;
    local_28[2] = 0xffffffff;
    local_28[0] = -1;
    local_28[1] = -1;
    local_30 = 0xffffffff;
    local_38 = 0xffffffffffffffff;
    bVar5 = operator-(in_stack_fffffffffffffa38._8_8_,in_stack_fffffffffffffa38._0_8_);
    local_5c = bVar5.m_floats._0_8_;
    local_54 = bVar5.m_floats._8_8_;
    bVar5 = operator-(in_stack_fffffffffffffa38._8_8_,in_stack_fffffffffffffa38._0_8_);
    local_6c = bVar5.m_floats._0_8_;
    local_64 = bVar5.m_floats._8_8_;
    bVar5 = btVector3::cross(in_stack_fffffffffffffa38._8_8_,in_stack_fffffffffffffa38._0_8_);
    local_4c = bVar5.m_floats._0_8_;
    local_44 = bVar5.m_floats._8_8_;
    local_3c = btVector3::length2((btVector3 *)0x19f1f3);
    if (*(float *)(*(long *)(in_RDI + 0x18) + 0x90) <= local_3c) {
      bVar5 = operator-(in_stack_fffffffffffffa38._8_8_,in_stack_fffffffffffffa38._0_8_);
      local_90 = bVar5.m_floats._0_8_;
      local_88 = bVar5.m_floats._8_8_;
      bVar5 = operator-(in_stack_fffffffffffffa38._8_8_,in_stack_fffffffffffffa38._0_8_);
      local_a0 = bVar5.m_floats._0_8_;
      local_98 = bVar5.m_floats._8_8_;
      bVar5 = btVector3::cross(in_stack_fffffffffffffa38._8_8_,in_stack_fffffffffffffa38._0_8_);
      local_80 = bVar5.m_floats._0_8_;
      local_78 = bVar5.m_floats._8_8_;
      local_70 = btVector3::length2((btVector3 *)0x19f2ab);
      if (*(float *)(*(long *)(in_RDI + 0x18) + 0x90) <= local_70) {
        for (local_a4 = 0; local_a4 < 3; local_a4 = local_a4 + 1) {
          for (local_a8 = 0; local_a8 < 3; local_a8 = local_a8 + 1) {
            bVar5 = operator-(in_stack_fffffffffffffa38._8_8_,in_stack_fffffffffffffa38._0_8_);
            local_b8 = bVar5.m_floats._0_8_;
            local_b0 = bVar5.m_floats._8_8_;
            bVar2 = btVector3::length2((btVector3 *)0x19f363);
            if (bVar2 < *(float *)(*(long *)(in_RDI + 0x18) + 0x90)) {
              local_28[local_28[3]] = local_a4;
              *(int *)((long)&local_38 + (long)local_28[3] * 4) = local_a8;
              local_28[3] = local_28[3] + 1;
              if (2 < local_28[3]) {
                return;
              }
            }
          }
          if (2 < local_28[3]) {
            return;
          }
        }
        if (((local_28[3] != 0) && (local_28[3] != 1)) && (local_28[3] == 2)) {
          if ((local_28[0] == 0) && (local_28[1] == 2)) {
            local_28[0] = 2;
            local_28[1] = 0;
            local_bc = local_38._4_4_;
            local_38 = CONCAT44((int)local_38,local_38._4_4_);
          }
          local_c0 = btGetHash(*(int *)(in_RDI + 8),*(int *)(in_RDI + 0xc));
          btHashInt::btHashInt(&local_cc,local_c0);
          local_c8 = btHashMap<btHashInt,_btTriangleInfo>::find
                               (in_stack_fffffffffffffa38._0_8_,
                                (btHashInt *)
                                CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
          if (local_c8 == (btTriangleInfo *)0x0) {
            btTriangleInfo::btTriangleInfo(&local_dc);
            btHashInt::btHashInt(&local_e0,local_c0);
            btHashMap<btHashInt,_btTriangleInfo>::insert
                      (in_stack_fffffffffffffa70,(btHashInt *)in_stack_fffffffffffffa68,
                       in_stack_fffffffffffffa58._8_8_);
            btHashInt::btHashInt(&local_e4,local_c0);
            local_c8 = btHashMap<btHashInt,_btTriangleInfo>::find
                                 (in_stack_fffffffffffffa38._0_8_,
                                  (btHashInt *)
                                  CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
          }
          local_e8 = local_28[0] + local_28[1];
          local_ec = 3 - local_e8;
          bVar5 = operator-(in_stack_fffffffffffffa38._8_8_,in_stack_fffffffffffffa38._0_8_);
          local_fc = bVar5.m_floats._0_8_;
          local_f4 = bVar5.m_floats._8_8_;
          btTriangleShape::btTriangleShape
                    ((btTriangleShape *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
                     in_stack_fffffffffffffa58._8_8_,in_stack_fffffffffffffa58._0_8_);
          local_184 = 3 - ((int)local_38 + local_38._4_4_);
          btTriangleShape::btTriangleShape
                    ((btTriangleShape *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
                     in_stack_fffffffffffffa58._8_8_,in_stack_fffffffffffffa58._0_8_);
          btVector3::btVector3(local_224);
          btVector3::btVector3(&local_234);
          btTriangleShape::calcNormal
                    ((btTriangleShape *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
          btTriangleShape::calcNormal
                    ((btTriangleShape *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
          btVector3::normalize
                    ((btVector3 *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
          bVar5 = btVector3::cross(in_stack_fffffffffffffa38._8_8_,in_stack_fffffffffffffa38._0_8_);
          local_250 = bVar5.m_floats._8_8_;
          local_3d8 = bVar5.m_floats[0];
          bStack_3d4 = bVar5.m_floats[1];
          local_258 = local_3d8;
          bStack_254 = bStack_3d4;
          pbVar1 = btVector3::normalize
                             ((btVector3 *)
                              CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
          local_248.m_floats._0_8_ = *(undefined8 *)pbVar1->m_floats;
          local_248.m_floats._8_8_ = *(undefined8 *)(pbVar1->m_floats + 2);
          bVar5 = operator-(in_stack_fffffffffffffa38._8_8_,in_stack_fffffffffffffa38._0_8_);
          local_268.m_floats._0_8_ = bVar5.m_floats._0_8_;
          local_268.m_floats._8_8_ = bVar5.m_floats._8_8_;
          bVar2 = btVector3::dot(&local_248,&local_268);
          if (bVar2 < 0.0) {
            local_26c = -1.0;
            btVector3::operator*=(&local_248,&local_26c);
          }
          bVar5 = btVector3::cross(in_stack_fffffffffffffa38._8_8_,in_stack_fffffffffffffa38._0_8_);
          local_290 = bVar5.m_floats._8_8_;
          local_438 = bVar5.m_floats[0];
          bStack_434 = bVar5.m_floats[1];
          local_298 = local_438;
          bStack_294 = bStack_434;
          pbVar1 = btVector3::normalize
                             ((btVector3 *)
                              CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
          local_288.m_floats._0_8_ = *(undefined8 *)pbVar1->m_floats;
          local_288.m_floats._8_8_ = *(undefined8 *)(pbVar1->m_floats + 2);
          bVar5 = operator-(in_stack_fffffffffffffa38._8_8_,in_stack_fffffffffffffa38._0_8_);
          local_2a8.m_floats._0_8_ = bVar5.m_floats._0_8_;
          local_2a8.m_floats._8_8_ = bVar5.m_floats._8_8_;
          bVar2 = btVector3::dot(&local_288,&local_2a8);
          if (bVar2 < 0.0) {
            local_2ac = -1.0;
            btVector3::operator*=(&local_288,&local_2ac);
          }
          local_2b0 = 0.0;
          local_2b4 = 0.0;
          bVar5 = btVector3::cross(in_stack_fffffffffffffa38._8_8_,in_stack_fffffffffffffa38._0_8_);
          local_2c4 = bVar5.m_floats._0_8_;
          local_2bc = bVar5.m_floats._8_8_;
          local_2c8 = btVector3::length2((btVector3 *)0x19fa16);
          local_2cc = 0.0;
          local_2cd = false;
          uVar3 = 0;
          uVar4 = 0;
          if (*(float *)(*(long *)(in_RDI + 0x18) + 0x8c) <= local_2c8) {
            btVector3::normalize
                      ((btVector3 *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
            bVar5 = btVector3::cross(in_stack_fffffffffffffa38._8_8_,in_stack_fffffffffffffa38._0_8_
                                    );
            local_2e0 = bVar5.m_floats._0_8_;
            local_2d8 = bVar5.m_floats._8_8_;
            btVector3::normalize
                      ((btVector3 *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
            local_2b0 = btGetAngle((btVector3 *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
                                   in_stack_fffffffffffffa58._8_8_);
            uVar3 = 0;
            uVar4 = 0;
            local_2b4 = 3.1415927 - local_2b0;
            local_2e4 = btVector3::dot(local_224,&local_288);
            local_2cd = local_2e4 < 0.0;
            if (local_2cd) {
              local_4e4 = local_2b4;
            }
            else {
              local_4e4 = -local_2b4;
            }
            local_2cc = local_4e4;
          }
          else {
            local_2b0 = 0.0;
            local_2b4 = 0.0;
          }
          pbVar1 = in_stack_fffffffffffffa38._0_8_;
          v1 = in_stack_fffffffffffffa38._8_8_;
          if (local_e8 == 1) {
            bVar5 = operator-(v1,pbVar1);
            local_2f4 = bVar5.m_floats._0_8_;
            local_2ec = bVar5.m_floats._8_8_;
            local_308 = -local_2cc;
            btQuaternion::btQuaternion
                      (in_stack_fffffffffffffa38._8_8_,in_stack_fffffffffffffa38._0_8_,
                       (btScalar *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
            bVar5 = quatRotate(in_stack_fffffffffffffa58._8_8_,in_stack_fffffffffffffa58._0_8_);
            local_318.m_floats._0_8_ = bVar5.m_floats._0_8_;
            local_318.m_floats._8_8_ = bVar5.m_floats._8_8_;
            local_31c = btVector3::dot(&local_318,&local_234);
            if (local_31c < 0.0) {
              local_320 = -1.0;
              btVector3::operator*=(&local_318,&local_320);
              local_c8->m_flags = local_c8->m_flags | 8;
            }
            local_c8->m_edgeV0V1Angle = -local_2cc;
            if ((local_2cd & 1U) != 0) {
              local_c8->m_flags = local_c8->m_flags | 1;
            }
          }
          else if (local_e8 == 2) {
            bVar5 = operator-(v1,pbVar1);
            local_330 = bVar5.m_floats._0_8_;
            local_328 = bVar5.m_floats._8_8_;
            local_344 = -local_2cc;
            btQuaternion::btQuaternion
                      (in_stack_fffffffffffffa38._8_8_,in_stack_fffffffffffffa38._0_8_,
                       (btScalar *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
            bVar5 = quatRotate(in_stack_fffffffffffffa58._8_8_,in_stack_fffffffffffffa58._0_8_);
            local_354.m_floats._0_8_ = bVar5.m_floats._0_8_;
            local_354.m_floats._8_8_ = bVar5.m_floats._8_8_;
            bVar2 = btVector3::dot(&local_354,&local_234);
            if (bVar2 < 0.0) {
              local_358 = -1.0;
              btVector3::operator*=(&local_354,&local_358);
              local_c8->m_flags = local_c8->m_flags | 0x20;
            }
            local_c8->m_edgeV2V0Angle = -local_2cc;
            if ((local_2cd & 1U) != 0) {
              local_c8->m_flags = local_c8->m_flags | 4;
            }
          }
          else if (local_e8 == 3) {
            bVar5 = operator-(v1,pbVar1);
            local_368 = bVar5.m_floats._0_8_;
            local_360 = bVar5.m_floats._8_8_;
            auVar6._8_4_ = uVar3;
            auVar6._0_8_ = local_360;
            auVar6._12_4_ = uVar4;
            local_37c = -local_2cc;
            btQuaternion::btQuaternion
                      (in_stack_fffffffffffffa38._8_8_,in_stack_fffffffffffffa38._0_8_,
                       (btScalar *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
            bVar5 = quatRotate(auVar6._8_8_,auVar6._0_8_);
            local_38c.m_floats._0_8_ = bVar5.m_floats._0_8_;
            local_38c.m_floats._8_8_ = bVar5.m_floats._8_8_;
            bVar2 = btVector3::dot(&local_38c,&local_234);
            if (bVar2 < 0.0) {
              local_c8->m_flags = local_c8->m_flags | 0x10;
              local_390 = -1.0;
              btVector3::operator*=(&local_38c,&local_390);
            }
            local_c8->m_edgeV1V2Angle = -local_2cc;
            if ((local_2cd & 1U) != 0) {
              local_c8->m_flags = local_c8->m_flags | 2;
            }
          }
          btTriangleShape::~btTriangleShape((btTriangleShape *)0x1a006c);
          btTriangleShape::~btTriangleShape((btTriangleShape *)0x1a0079);
        }
      }
    }
  }
  return;
}

Assistant:

virtual void processTriangle(btVector3* triangle, int partId, int triangleIndex)
	{
		//skip self-collisions
		if ((m_partIdA == partId) && (m_triangleIndexA == triangleIndex))
			return;

		//skip duplicates (disabled for now)
		//if ((m_partIdA <= partId) && (m_triangleIndexA <= triangleIndex))
		//	return;

		//search for shared vertices and edges
		int numshared = 0;
		int sharedVertsA[3]={-1,-1,-1};
		int sharedVertsB[3]={-1,-1,-1};

		///skip degenerate triangles
		btScalar crossBSqr = ((triangle[1]-triangle[0]).cross(triangle[2]-triangle[0])).length2();
		if (crossBSqr < m_triangleInfoMap->m_equalVertexThreshold)
			return;


		btScalar crossASqr = ((m_triangleVerticesA[1]-m_triangleVerticesA[0]).cross(m_triangleVerticesA[2]-m_triangleVerticesA[0])).length2();
		///skip degenerate triangles
		if (crossASqr< m_triangleInfoMap->m_equalVertexThreshold)
			return;

#if 0
		printf("triangle A[0]	=	(%f,%f,%f)\ntriangle A[1]	=	(%f,%f,%f)\ntriangle A[2]	=	(%f,%f,%f)\n",
			m_triangleVerticesA[0].getX(),m_triangleVerticesA[0].getY(),m_triangleVerticesA[0].getZ(),
			m_triangleVerticesA[1].getX(),m_triangleVerticesA[1].getY(),m_triangleVerticesA[1].getZ(),
			m_triangleVerticesA[2].getX(),m_triangleVerticesA[2].getY(),m_triangleVerticesA[2].getZ());

		printf("partId=%d, triangleIndex=%d\n",partId,triangleIndex);
		printf("triangle B[0]	=	(%f,%f,%f)\ntriangle B[1]	=	(%f,%f,%f)\ntriangle B[2]	=	(%f,%f,%f)\n",
			triangle[0].getX(),triangle[0].getY(),triangle[0].getZ(),
			triangle[1].getX(),triangle[1].getY(),triangle[1].getZ(),
			triangle[2].getX(),triangle[2].getY(),triangle[2].getZ());
#endif

		for (int i=0;i<3;i++)
		{
			for (int j=0;j<3;j++)
			{
				if ( (m_triangleVerticesA[i]-triangle[j]).length2() < m_triangleInfoMap->m_equalVertexThreshold)
				{
					sharedVertsA[numshared] = i;
					sharedVertsB[numshared] = j;
					numshared++;
					///degenerate case
					if(numshared >= 3)
						return;
				}
			}
			///degenerate case
			if(numshared >= 3)
				return;
		}
		switch (numshared)
		{
		case 0:
			{
				break;
			}
		case 1:
			{
				//shared vertex
				break;
			}
		case 2:
			{
				//shared edge
				//we need to make sure the edge is in the order V2V0 and not V0V2 so that the signs are correct
				if (sharedVertsA[0] == 0 && sharedVertsA[1] == 2)
				{
					sharedVertsA[0] = 2;
					sharedVertsA[1] = 0;
					int tmp = sharedVertsB[1];
					sharedVertsB[1] = sharedVertsB[0];
					sharedVertsB[0] = tmp;
				}

				int hash = btGetHash(m_partIdA,m_triangleIndexA);

				btTriangleInfo* info = m_triangleInfoMap->find(hash);
				if (!info)
				{
					btTriangleInfo tmp;
					m_triangleInfoMap->insert(hash,tmp);
					info = m_triangleInfoMap->find(hash);
				}

				int sumvertsA = sharedVertsA[0]+sharedVertsA[1];
				int otherIndexA = 3-sumvertsA;

				
				btVector3 edge(m_triangleVerticesA[sharedVertsA[1]]-m_triangleVerticesA[sharedVertsA[0]]);

				btTriangleShape tA(m_triangleVerticesA[0],m_triangleVerticesA[1],m_triangleVerticesA[2]);
				int otherIndexB = 3-(sharedVertsB[0]+sharedVertsB[1]);

				btTriangleShape tB(triangle[sharedVertsB[1]],triangle[sharedVertsB[0]],triangle[otherIndexB]);
				//btTriangleShape tB(triangle[0],triangle[1],triangle[2]);

				btVector3 normalA;
				btVector3 normalB;
				tA.calcNormal(normalA);
				tB.calcNormal(normalB);
				edge.normalize();
				btVector3 edgeCrossA = edge.cross(normalA).normalize();

				{
					btVector3 tmp = m_triangleVerticesA[otherIndexA]-m_triangleVerticesA[sharedVertsA[0]];
					if (edgeCrossA.dot(tmp) < 0)
					{
						edgeCrossA*=-1;
					}
				}

				btVector3 edgeCrossB = edge.cross(normalB).normalize();

				{
					btVector3 tmp = triangle[otherIndexB]-triangle[sharedVertsB[0]];
					if (edgeCrossB.dot(tmp) < 0)
					{
						edgeCrossB*=-1;
					}
				}

				btScalar	angle2 = 0;
				btScalar	ang4 = 0.f;


				btVector3 calculatedEdge = edgeCrossA.cross(edgeCrossB);
				btScalar len2 = calculatedEdge.length2();

				btScalar correctedAngle(0);
				//btVector3 calculatedNormalB = normalA;
				bool isConvex = false;

				if (len2<m_triangleInfoMap->m_planarEpsilon)
				{
					angle2 = 0.f;
					ang4 = 0.f;
				} else
				{

					calculatedEdge.normalize();
					btVector3 calculatedNormalA = calculatedEdge.cross(edgeCrossA);
					calculatedNormalA.normalize();
					angle2 = btGetAngle(calculatedNormalA,edgeCrossA,edgeCrossB);
					ang4 = SIMD_PI-angle2;
					btScalar dotA = normalA.dot(edgeCrossB);
					///@todo: check if we need some epsilon, due to floating point imprecision
					isConvex = (dotA<0.);

					correctedAngle = isConvex ? ang4 : -ang4;
				}

				

				
							
				//alternatively use 
				//btVector3 calculatedNormalB2 = quatRotate(orn,normalA);


				switch (sumvertsA)
				{
				case 1:
					{
						btVector3 edge = m_triangleVerticesA[0]-m_triangleVerticesA[1];
						btQuaternion orn(edge,-correctedAngle);
						btVector3 computedNormalB = quatRotate(orn,normalA);
						btScalar bla = computedNormalB.dot(normalB);
						if (bla<0)
						{
							computedNormalB*=-1;
							info->m_flags |= TRI_INFO_V0V1_SWAP_NORMALB;
						}
#ifdef DEBUG_INTERNAL_EDGE
						if ((computedNormalB-normalB).length()>0.0001)
						{
							printf("warning: normals not identical\n");
						}
#endif//DEBUG_INTERNAL_EDGE

						info->m_edgeV0V1Angle = -correctedAngle;

						if (isConvex)
							info->m_flags |= TRI_INFO_V0V1_CONVEX;
						break;
					}
				case 2:
					{
						btVector3 edge = m_triangleVerticesA[2]-m_triangleVerticesA[0];
						btQuaternion orn(edge,-correctedAngle);
						btVector3 computedNormalB = quatRotate(orn,normalA);
						if (computedNormalB.dot(normalB)<0)
						{
							computedNormalB*=-1;
							info->m_flags |= TRI_INFO_V2V0_SWAP_NORMALB;
						}

#ifdef DEBUG_INTERNAL_EDGE
						if ((computedNormalB-normalB).length()>0.0001)
						{
							printf("warning: normals not identical\n");
						}
#endif //DEBUG_INTERNAL_EDGE
						info->m_edgeV2V0Angle = -correctedAngle;
						if (isConvex)
							info->m_flags |= TRI_INFO_V2V0_CONVEX;
						break;	
					}
				case 3:
					{
						btVector3 edge = m_triangleVerticesA[1]-m_triangleVerticesA[2];
						btQuaternion orn(edge,-correctedAngle);
						btVector3 computedNormalB = quatRotate(orn,normalA);
						if (computedNormalB.dot(normalB)<0)
						{
							info->m_flags |= TRI_INFO_V1V2_SWAP_NORMALB;
							computedNormalB*=-1;
						}
#ifdef DEBUG_INTERNAL_EDGE
						if ((computedNormalB-normalB).length()>0.0001)
						{
							printf("warning: normals not identical\n");
						}
#endif //DEBUG_INTERNAL_EDGE
						info->m_edgeV1V2Angle = -correctedAngle;

						if (isConvex)
							info->m_flags |= TRI_INFO_V1V2_CONVEX;
						break;
					}
				}

				break;
			}
		default:
			{
				//				printf("warning: duplicate triangle\n");
			}

		}
	}